

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

char16 * Js::VariableWalkerBase::ParseFunctionName
                   (char16 *displayNameBuffer,charcount_t displayNameBufferLength,
                   ScriptContext *scriptContext)

{
  int iVar1;
  char16_t *pcVar2;
  Memory *this;
  ulong sizeInBytes;
  
  if (0x1d < displayNameBufferLength) {
    iVar1 = PAL_wmemcmp(displayNameBuffer,L"function ",9);
    if (iVar1 == 0) {
      pcVar2 = PAL_wcschr(displayNameBuffer,L'(');
      if (pcVar2 != (char16_t *)0x0) {
        this = (Memory *)GetArenaFromContext(scriptContext);
        pcVar2 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                           (this,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                            (ulong)(displayNameBufferLength - 0x1c));
        if (pcVar2 != (char16_t *)0x0) {
          sizeInBytes = (ulong)(displayNameBufferLength * 2 - 0x3a);
          js_memcpy_s(pcVar2,sizeInBytes,displayNameBuffer + 9,sizeInBytes);
          pcVar2[displayNameBufferLength - 0x1d] = L'\0';
          displayNameBuffer = pcVar2;
        }
      }
    }
  }
  return displayNameBuffer;
}

Assistant:

const char16 * VariableWalkerBase::ParseFunctionName(const char16 * displayNameBuffer, const charcount_t displayNameBufferLength, ScriptContext* scriptContext)
    {
        const charcount_t funcStringLength = _countof(JS_DISPLAY_STRING_FUNCTION_HEADER) - 1; // discount the ending null character in string literal
        const charcount_t templateStringLength = funcStringLength + _countof(JS_DISPLAY_STRING_FUNCTION_BODY) - 1; // discount the ending null character in string literal
        // If the string doesn't meet our expected format; return the original string.
        if (displayNameBufferLength <= templateStringLength || (wmemcmp(displayNameBuffer, JS_DISPLAY_STRING_FUNCTION_HEADER, funcStringLength) != 0))
        {
            return displayNameBuffer;
        }

        // Look for the left parenthesis, if we don't find one; return the original string.
        const char16* parenChar = wcschr(displayNameBuffer, '(');
        if (parenChar == nullptr)
        {
            return displayNameBuffer;
        }

        charcount_t actualFunctionNameLength = displayNameBufferLength - templateStringLength;
        uint byteLengthForCopy = sizeof(char16) * actualFunctionNameLength;
        char16 * actualFunctionNameBuffer = AnewArray(GetArenaFromContext(scriptContext), char16, actualFunctionNameLength + 1); // The last character will be the null character.
        if (actualFunctionNameBuffer == nullptr)
        {
            return displayNameBuffer;
        }
        js_memcpy_s(actualFunctionNameBuffer, byteLengthForCopy, displayNameBuffer + funcStringLength, byteLengthForCopy);
        actualFunctionNameBuffer[actualFunctionNameLength] = _u('\0');

        return actualFunctionNameBuffer;
    }